

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isConformantSchemeName(XMLCh *scheme)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  XMLCh *pXVar4;
  
  if ((scheme != (XMLCh *)0x0) && (bVar1 = XMLString::isAlpha(*scheme), bVar1)) {
    pXVar4 = scheme + 1;
    while( true ) {
      bVar1 = *pXVar4 == L'\0';
      if (bVar1) {
        return bVar1;
      }
      bVar2 = XMLString::isAlphaNum(*pXVar4);
      if ((!bVar2) && (iVar3 = XMLString::indexOf(L"+-.",*pXVar4), iVar3 == -1)) break;
      pXVar4 = pXVar4 + 1;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool XMLUri::isConformantSchemeName(const XMLCh* const scheme)
{
	if ( !scheme )
        return false;

    const XMLCh* tmpStr = scheme;
    if (!XMLString::isAlpha(*tmpStr))     // first: alpha
        return false;

    // second onwards: ( alpha | digit | "+" | "-" | "." )
    tmpStr++;
    while (*tmpStr)
    {
        if ( !XMLString::isAlphaNum(*tmpStr) &&
             (XMLString::indexOf(SCHEME_CHARACTERS, *tmpStr) == -1))
            return false;

        tmpStr++;
    }

    return true;
}